

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O2

shared_ptr<libtorrent::torrent_plugin>
libtorrent::create_ut_pex_plugin(torrent_handle *th,client_data_t param_2)

{
  byte bVar1;
  bool bVar2;
  session_settings *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<libtorrent::torrent_plugin> sVar5;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_pex_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_pex_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  torrent_handle::native_handle((torrent_handle *)&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_ptr);
  bVar1 = (((((torrent_hot_members *)((long)local_48._M_alloc + 8))->m_torrent_file).
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_flags).m_val;
  _Var4._M_pi = extraout_RDX;
  if ((bVar1 & 2) == 0) {
    if ((bVar1 & 4) != 0) {
      this = aux::torrent::settings((torrent *)local_48._M_alloc);
      bVar2 = aux::session_settings::get_bool(this,0x8017);
      _Var4._M_pi = extraout_RDX_00;
      if (!bVar2) goto LAB_00346f79;
    }
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004d16d0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ut_pex_plugin_004d1720;
    *(allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_pex_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_pex_plugin>,_(__gnu_cxx::_Lock_policy)2>_>
      **)&p_Var3[1]._M_use_count = local_48._M_alloc;
    p_Var3[2]._M_use_count = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)&p_Var3[3]._M_use_count = &p_Var3[2]._M_use_count;
    p_Var3[4]._vptr__Sp_counted_base = (_func_int **)&p_Var3[2]._M_use_count;
    p_Var3[4]._M_use_count = 0;
    p_Var3[4]._M_weak_count = 0;
    p_Var3[5]._vptr__Sp_counted_base = (_func_int **)0x8000000000000000;
    *(undefined8 *)((long)&p_Var3[6]._vptr__Sp_counted_base + 4) = 0;
    *(undefined8 *)&p_Var3[6]._M_weak_count = 0;
    p_Var3[5]._M_use_count = 0;
    p_Var3[5]._M_weak_count = 0;
    p_Var3[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    local_48._M_ptr = (pointer)0x0;
    local_48._M_alloc = &__a2;
    ::std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_pex_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_pex_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_48);
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var3 + 1);
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    local_38 = 0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    _Var4._M_pi = extraout_RDX_01;
  }
  else {
LAB_00346f79:
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  sVar5.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar5.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)th;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar5.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> create_ut_pex_plugin(torrent_handle const& th, client_data_t)
	{
		aux::torrent* t = th.native_handle().get();
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !t->settings().get_bool(settings_pack::allow_i2p_mixed)))
		{
			return {};
		}
		return std::make_shared<ut_pex_plugin>(*t);
	}